

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ParseTest::~ParseTest(ParseTest *this)

{
  code *pcVar1;
  ParseTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual void SetUp() {
        _test_input = "xxxxx\t22\t3.3\tss\tsss\t3:2222,3333,44444\t3:2.0,3.0,4.0\t33 44 55\n";
        _test_size = 8;
        _test_array_length = 3;
    }